

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<long_double>::AddKel
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int64_t iVar4;
  long *plVar5;
  longdouble *plVar6;
  TPZVec<long> *in_RCX;
  TPZVec<long> *in_RDX;
  long *in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 Var7;
  longdouble prevval;
  int64_t jeqs;
  int64_t ieqs;
  int64_t jeq;
  int64_t ieq;
  int64_t jcoef;
  int64_t icoef;
  int64_t nelem;
  undefined8 local_68;
  undefined2 uVar8;
  undefined6 in_stack_ffffffffffffffa2;
  long lVar9;
  TPZFMatrix<long_double> *pTVar10;
  long local_38;
  long local_30;
  
  iVar4 = TPZVec<long>::NElements(in_RDX);
  iVar3 = (**(code **)(*in_RDI + 0x80))();
  if (iVar3 == 0) {
    for (local_30 = 0; local_30 < iVar4; local_30 = local_30 + 1) {
      plVar5 = TPZVec<long>::operator[](in_RCX,local_30);
      lVar1 = *plVar5;
      plVar5 = TPZVec<long>::operator[](in_RDX,local_30);
      pTVar10 = (TPZFMatrix<long_double> *)*plVar5;
      for (local_38 = 0; local_38 < iVar4; local_38 = local_38 + 1) {
        plVar5 = TPZVec<long>::operator[](in_RCX,local_38);
        lVar2 = *plVar5;
        plVar5 = TPZVec<long>::operator[](in_RDX,local_38);
        lVar9 = *plVar5;
        (**(code **)(*in_RDI + 0x120))(in_RDI,lVar1,lVar2);
        local_68 = (undefined8)in_ST0;
        uVar8 = (undefined2)((unkuint10)in_ST0 >> 0x40);
        plVar6 = TPZFMatrix<long_double>::operator()
                           (pTVar10,lVar9,CONCAT62(in_stack_ffffffffffffffa2,uVar8));
        local_68 = SUB108((longdouble)CONCAT28(uVar8,local_68) + *plVar6,0);
        Var7 = in_ST6;
        (**(code **)(*in_RDI + 0x118))(in_RDI,lVar1,lVar2,&local_68);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = Var7;
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < iVar4; local_30 = local_30 + 1) {
      plVar5 = TPZVec<long>::operator[](in_RCX,local_30);
      lVar1 = *plVar5;
      plVar5 = TPZVec<long>::operator[](in_RDX,local_30);
      pTVar10 = (TPZFMatrix<long_double> *)*plVar5;
      for (local_38 = local_30; local_38 < iVar4; local_38 = local_38 + 1) {
        plVar5 = TPZVec<long>::operator[](in_RCX,local_38);
        lVar2 = *plVar5;
        plVar5 = TPZVec<long>::operator[](in_RDX,local_38);
        lVar9 = *plVar5;
        (**(code **)(*in_RDI + 0x120))(in_RDI,lVar1,lVar2);
        local_68 = (undefined8)in_ST0;
        uVar8 = (undefined2)((unkuint10)in_ST0 >> 0x40);
        plVar6 = TPZFMatrix<long_double>::operator()
                           (pTVar10,lVar9,CONCAT62(in_stack_ffffffffffffffa2,uVar8));
        local_68 = SUB108((longdouble)CONCAT28(uVar8,local_68) + *plVar6,0);
        Var7 = in_ST6;
        (**(code **)(*in_RDI + 0x118))(in_RDI,lVar1,lVar2,&local_68);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = Var7;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}